

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_discover.cc
# Opt level: O0

int runDiscover(string *command,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  iterator iVar5;
  iterator iVar6;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  __last;
  iterator filter;
  reference this;
  int in_ESI;
  rep rVar7;
  DeviceInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> filtered_infos;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  it;
  time_point tend;
  time_point tstart;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  Discover discover;
  invalid_argument *ex;
  string p;
  int i;
  DeviceFilter device_filter;
  bool serialonly;
  bool iponly;
  bool printheader;
  string *in_stack_fffffffffffffd88;
  undefined6 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  in_stack_fffffffffffffd98;
  value_type *__x;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  in_stack_fffffffffffffda0;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *this_00;
  DeviceFilter *in_stack_fffffffffffffdb0;
  const_iterator __first;
  Discover *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  Discover *in_stack_fffffffffffffe40;
  duration<double,_std::ratio<1L,_1000L>_> local_150;
  undefined8 local_148;
  undefined8 local_140;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_138;
  DeviceFilter *in_stack_fffffffffffffef0;
  char **in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  allocator<char> local_c9;
  string local_c8 [12];
  undefined4 in_stack_ffffffffffffff44;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *in_stack_ffffffffffffff48
  ;
  Discover *in_stack_ffffffffffffff50;
  undefined4 local_a4;
  int local_4;
  
  DeviceFilter::DeviceFilter(in_stack_fffffffffffffdb0);
  local_a4 = 0;
  while ((int)local_a4 < in_ESI) {
    local_a4 = local_a4 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,
                        CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
               in_stack_fffffffffffffdc8,(allocator<char> *)in_stack_fffffffffffffdc0);
    std::allocator<char>::~allocator(&local_c9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd97,
                                     CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
                            (char *)in_stack_fffffffffffffd88);
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffd97,
                                              CONCAT16(in_stack_fffffffffffffd96,
                                                       in_stack_fffffffffffffd90)),
                                  (char *)in_stack_fffffffffffffd88), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffd97,
                                             CONCAT16(in_stack_fffffffffffffd96,
                                                      in_stack_fffffffffffffd90)),
                                 (char *)in_stack_fffffffffffffd88), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffd97,
                                          CONCAT16(in_stack_fffffffffffffd96,
                                                   in_stack_fffffffffffffd90)),
                                (char *)in_stack_fffffffffffffd88), bVar1)) {
LAB_00131118:
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd97,
                                       CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)
                                      ),(char *)in_stack_fffffffffffffd88);
      if (bVar1) {
        iVar3 = parseFilterArguments
                          (in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef0);
        local_a4 = iVar3 + local_a4;
        goto LAB_00131118;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffd97,
                                       CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)
                                      ),(char *)in_stack_fffffffffffffd88);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffd97,
                                              CONCAT16(in_stack_fffffffffffffd96,
                                                       in_stack_fffffffffffffd90)),
                                  (char *)in_stack_fffffffffffffd88), bVar1)) {
        printHelp((ostream *)
                  CONCAT17(in_stack_fffffffffffffd97,
                           CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
                  in_stack_fffffffffffffd88);
        local_4 = 0;
        bVar1 = true;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        poVar4 = std::operator<<(poVar4,local_c8);
        std::operator<<(poVar4,'\n');
        printHelp((ostream *)
                  CONCAT17(in_stack_fffffffffffffd97,
                           CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
                  in_stack_fffffffffffffd88);
        local_4 = 1;
        bVar1 = true;
      }
    }
    std::__cxx11::string::~string(local_c8);
    if (bVar1) goto LAB_00131565;
  }
  rcdiscover::Discover::Discover(in_stack_fffffffffffffdc0);
  rcdiscover::Discover::broadcastRequest(in_stack_fffffffffffffe40);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)0x131183);
  local_148 = std::chrono::_V2::steady_clock::now();
  local_140 = local_148;
  while( true ) {
    bVar2 = rcdiscover::Discover::getResponse
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44
                      );
    bVar1 = true;
    if (!bVar2) {
      std::chrono::operator-
                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffd98._M_current,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd97,
                             CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)));
      std::chrono::duration<double,std::ratio<1l,1000l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffda0._M_current,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)
                 in_stack_fffffffffffffd98._M_current);
      rVar7 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_150);
      bVar1 = rVar7 < 1000.0;
    }
    if (!bVar1) break;
    local_148 = std::chrono::_V2::steady_clock::now();
  }
  __first._M_current = (DeviceInfo *)&local_138;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             in_stack_fffffffffffffd88);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             in_stack_fffffffffffffd88);
  std::
  sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  this_00 = &local_138;
  iVar5 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                    ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                     in_stack_fffffffffffffd88);
  iVar6 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                    ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                     in_stack_fffffffffffffd88);
  __last = std::
           unique<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,runDiscover(std::__cxx11::string_const&,int,char**)::__0>
                     (iVar5._M_current,iVar6._M_current);
  __gnu_cxx::
  __normal_iterator<rcdiscover::DeviceInfo_const*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>
  ::__normal_iterator<rcdiscover::DeviceInfo*>
            ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)CONCAT17(in_stack_fffffffffffffd97,
                         CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
             (__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)in_stack_fffffffffffffd88);
  __x = (value_type *)&local_138;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             in_stack_fffffffffffffd88);
  __gnu_cxx::
  __normal_iterator<rcdiscover::DeviceInfo_const*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>
  ::__normal_iterator<rcdiscover::DeviceInfo*>
            ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)CONCAT17(in_stack_fffffffffffffd97,
                         CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)),
             (__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)in_stack_fffffffffffffd88);
  iVar5 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::erase
                    (this_00,__first,__last._M_current);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)0x1313cd);
  iVar6 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                    ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                     in_stack_fffffffffffffd88);
  filter = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                     ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                      in_stack_fffffffffffffd88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd97,
                                        CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90
                                                )),
                            (__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                             *)in_stack_fffffffffffffd88), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
           ::operator*((__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                        *)&stack0xfffffffffffffe28);
    in_stack_fffffffffffffd97 = rcdiscover::DeviceInfo::isValid(this);
    if (((bool)in_stack_fffffffffffffd97) &&
       (in_stack_fffffffffffffd96 = filterDevice(iVar6._M_current,(DeviceFilter *)filter._M_current)
       , (bool)in_stack_fffffffffffffd96)) {
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                 iVar5._M_current,__x);
    }
    __gnu_cxx::
    __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
    ::operator++((__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                  *)&stack0xfffffffffffffe28);
  }
  printDeviceTable((ostream *)
                   filtered_infos.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                   filtered_infos.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   filtered_infos.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start._7_1_,
                   filtered_infos.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start._6_1_,
                   filtered_infos.
                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start._5_1_);
  local_4 = 0;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             iVar5._M_current);
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             iVar5._M_current);
  rcdiscover::Discover::~Discover
            ((Discover *)
             CONCAT17(in_stack_fffffffffffffd97,
                      CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)));
LAB_00131565:
  DeviceFilter::~DeviceFilter
            ((DeviceFilter *)
             CONCAT17(in_stack_fffffffffffffd97,
                      CONCAT16(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90)));
  return local_4;
}

Assistant:

int runDiscover(const std::string &command, int argc, char **argv)
{
  // interpret command line parameters

  bool printheader = true;
  bool iponly = false;
  bool serialonly = false;
  DeviceFilter device_filter;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-iponly" || p == "--iponly")
    {
      iponly = true;
      printheader = false;
    }
    else if (p == "-serialonly" || p == "--serialonly")
    {
      serialonly = true;
      printheader = false;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        return 1;
      }

      printheader = false;
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  // broadcast discover request

  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::vector<rcdiscover::DeviceInfo> infos;

  // get all responses, sort them and remove multiple entries

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  const auto it = std::unique(infos.begin(), infos.end(),
                              [](const rcdiscover::DeviceInfo &lhs,
                                 const rcdiscover::DeviceInfo &rhs)
                              {
                                return lhs.getMAC() == rhs.getMAC() &&
                                       lhs.getIfaceName() == rhs.getIfaceName();
                              });
  infos.erase(it, infos.end());

  // go through all valid entries

  std::vector<rcdiscover::DeviceInfo> filtered_infos;
  for (rcdiscover::DeviceInfo &info : infos)
  {
    if (!info.isValid())
    {
      continue;
    }

    // filter as requested
    if (!filterDevice(info, device_filter)) continue;

    filtered_infos.push_back(info);
  }

  printDeviceTable(std::cout, filtered_infos, printheader, iponly, serialonly);

  return 0;
}